

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

int Ivy_ManIsAcyclic(Ivy_Man_t *p)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  Ivy_Obj_t *pObj_00;
  Ivy_Obj_t *pObj_01;
  int local_20;
  int local_1c;
  int i;
  int fAcyclic;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  Ivy_ManIncrementTravId(p);
  Ivy_ManIncrementTravId(p);
  local_1c = 1;
  local_20 = 0;
  do {
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar2 <= local_20) {
      return local_1c;
    }
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_20);
    if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar2 = Ivy_ObjIsCo(pObj_00), iVar2 != 0)) {
      pObj_01 = Ivy_ObjFanin0(pObj_00);
      local_1c = Ivy_ManIsAcyclic_rec(p,pObj_01);
      __stream = _stdout;
      if (local_1c == 0) {
        iVar2 = Ivy_ObjIsLatch(pObj_00);
        pcVar1 = "oPO";
        if (iVar2 != 0) {
          pcVar1 = ".latch";
        }
        uVar3 = Ivy_ObjId(pObj_00);
        fprintf(__stream," (cone of %s \"%d\")\n",pcVar1 + 1,(ulong)uVar3);
        return 0;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int Ivy_ManIsAcyclic( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int fAcyclic, i;
    // set the traversal ID for this DFS ordering
    Ivy_ManIncrementTravId( p );   
    Ivy_ManIncrementTravId( p );   
    // pObj->TravId == pNet->nTravIds      means "pObj is on the path"
    // pObj->TravId == pNet->nTravIds - 1  means "pObj is visited but is not on the path"
    // pObj->TravId <  pNet->nTravIds - 1  means "pObj is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Ivy_ManForEachCo( p, pObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Ivy_ManIsAcyclic_rec(p, Ivy_ObjFanin0(pObj))) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " (cone of %s \"%d\")\n", Ivy_ObjIsLatch(pObj)? "latch" : "PO", Ivy_ObjId(pObj) );
        break;
    }
    return fAcyclic;
}